

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpiabi_defn_functions_fortran.h
# Opt level: O0

void mpiabi_group_translate_ranks_
               (MPIABI_Fint *group1,MPIABI_Fint *n,int *ranks1,MPIABI_Fint *group2,int *ranks2,
               MPIABI_Fint *ierror)

{
  MPIABI_Fint *ierror_local;
  int *ranks2_local;
  MPIABI_Fint *group2_local;
  int *ranks1_local;
  MPIABI_Fint *n_local;
  MPIABI_Fint *group1_local;
  
  mpi_group_translate_ranks_(group1,n,ranks1,group2,ranks2,ierror);
  return;
}

Assistant:

void mpiabi_group_translate_ranks_(
  const MPIABI_Fint * group1,
  const MPIABI_Fint * n,
  const int * ranks1,
  const MPIABI_Fint * group2,
  int * ranks2,
  MPIABI_Fint * ierror
) {
  return mpi_group_translate_ranks_(
    group1,
    n,
    ranks1,
    group2,
    ranks2,
    ierror
  );
}